

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

OrphanBuilder *
capnp::_::OrphanBuilder::initText
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ByteCount size)

{
  uint size_00;
  WirePointer *ref;
  word *pwVar1;
  ThrowOverflow local_55 [13];
  undefined1 local_48 [8];
  SegmentAnd<capnp::Text::Builder> allocation;
  ByteCount size_local;
  CapTableBuilder *capTable_local;
  BuilderArena *arena_local;
  OrphanBuilder *result;
  
  allocation.value.content.size_._3_1_ = 0;
  allocation.value.content.size_._4_4_ = size;
  OrphanBuilder(__return_storage_ptr__);
  ref = tagAsPtr(__return_storage_ptr__);
  size_00 = assertMax<536870910u,unsigned_int,kj::ThrowOverflow>
                      (allocation.value.content.size_._4_4_,local_55);
  WireHelpers::initTextPointer
            ((SegmentAnd<capnp::Text::Builder> *)local_48,ref,(SegmentBuilder *)0x0,capTable,size_00
             ,arena);
  __return_storage_ptr__->segment = (SegmentBuilder *)local_48;
  __return_storage_ptr__->capTable = capTable;
  pwVar1 = (word *)Text::Builder::begin((Builder *)&allocation);
  __return_storage_ptr__->location = pwVar1;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initText(
    BuilderArena* arena, CapTableBuilder* capTable, ByteCount size) {
  OrphanBuilder result;
  auto allocation = WireHelpers::initTextPointer(result.tagAsPtr(), nullptr, capTable,
      assertMax<MAX_TEXT_SIZE>(size, ThrowOverflow()), arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value.begin());
  return result;
}